

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

void __thiscall caffe::TransformationParameter::SharedCtor(TransformationParameter *this)

{
  string *default_value;
  TransformationParameter *this_local;
  
  this->_cached_size_ = 0;
  default_value = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::UnsafeSetDefault(&this->mean_file_,default_value);
  memset(&this->crop_size_,0,7);
  this->scale_ = 1.0;
  return;
}

Assistant:

void TransformationParameter::SharedCtor() {
  _cached_size_ = 0;
  mean_file_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  ::memset(&crop_size_, 0, reinterpret_cast<char*>(&force_gray_) -
    reinterpret_cast<char*>(&crop_size_) + sizeof(force_gray_));
  scale_ = 1;
}